

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O1

void __thiscall
soul::HEARTGenerator::HEARTGenerator
          (HEARTGenerator *this,ModuleBase *source,Module *targetModule,uint32_t maxDepth)

{
  Function *f;
  Module *pMVar1;
  pointer pcVar2;
  undefined8 *puVar3;
  int iVar4;
  undefined4 extraout_var;
  Identifier IVar6;
  Function *pFVar7;
  undefined4 extraout_var_00;
  IdentifierPath *path_00;
  char *location;
  char *message;
  long *plVar8;
  pool_ref<soul::AST::VariableDeclaration> *v;
  undefined8 *puVar9;
  IdentifierPath path;
  string local_120;
  string local_100;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_e0;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_88;
  long *plVar5;
  
  (this->super_ASTVisitor)._vptr_ASTVisitor = (_func_int **)&PTR__HEARTGenerator_00306b48;
  (this->sourceGraph).object = (Graph *)0x0;
  (this->sourceProcessor).object = (Processor *)0x0;
  this->module = targetModule;
  this->loopIndex = 0;
  this->ifIndex = 0;
  this->parsingStateVariables = false;
  (this->builder).super_BlockBuilder.module = targetModule;
  (this->builder).super_BlockBuilder.currentBlock.object = (Block *)0x0;
  (this->builder).super_BlockBuilder.lastStatementInCurrentBlock.object = (Statement *)0x0;
  (this->builder).super_BlockBuilder._vptr_BlockBuilder =
       (_func_int **)&PTR__FunctionBuilder_00306d48;
  (this->builder).currentFunction.object = (Function *)0x0;
  (this->builder).blockIndex = 0;
  (this->builder).localVarIndex = 0;
  *(undefined8 *)&(this->builder).localVarIndex = 0;
  *(undefined8 *)((long)&(this->currentTargetVariable).object + 4) = 0;
  this->maxExpressionDepth = maxDepth;
  (this->breakTarget).object = (Block *)0x0;
  (this->continueTarget).object = (Block *)0x0;
  (*(source->super_ASTObject)._vptr_ASTObject[0xd])(&local_e0);
  if (local_e0.numActive == 0) {
    iVar4 = 0xaa;
    location = "back";
    message = "! empty()";
  }
  else {
    if (local_e0.items[local_e0.numActive - 1].name != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->module->shortName);
      IdentifierPath::toString_abi_cxx11_(&local_100,(IdentifierPath *)&local_e0);
      std::__cxx11::string::operator=((string *)&this->module->fullName,(string *)&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      ArrayWithPreallocation<soul::Identifier,_8UL>::ArrayWithPreallocation(&local_88,&local_e0);
      getOriginalModulePath_abi_cxx11_(&local_100,(HEARTGenerator *)&local_88,path_00);
      std::__cxx11::string::operator=
                ((string *)&this->module->originalFullName,(string *)&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      local_88.numActive = 0;
      if ((Processor *)0x8 < local_88.numAllocated) {
        if (local_88.items != (Identifier *)0x0) {
          operator_delete__(local_88.items);
        }
        local_88.items = (Identifier *)local_88.space;
        local_88.numAllocated = 8;
      }
      iVar4 = (*(source->super_ASTObject)._vptr_ASTObject[0xc])(source);
      plVar5 = (long *)CONCAT44(extraout_var,iVar4);
      if (plVar5 != (long *)0x0) {
        plVar8 = (long *)*plVar5;
        plVar5 = (long *)plVar5[1];
        if (plVar8 != plVar5) {
          do {
            f = (Function *)*plVar8;
            if ((f->genericWildcards).
                super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (f->genericWildcards).
                super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              IVar6 = getFunctionName(this,f);
              if (IVar6.name == (string *)0x0) {
                throwInternalCompilerError
                          ("isValid()","operator const std::basic_string<char> &",0x21);
              }
              pMVar1 = this->module;
              pcVar2 = ((IVar6.name)->_M_dataplus)._M_p;
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_120,pcVar2,pcVar2 + (IVar6.name)->_M_string_length);
              pFVar7 = Module::Functions::add(&pMVar1->functions,&local_120,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p,
                                local_120.field_2._M_allocated_capacity + 1);
              }
              *(Function **)(*plVar8 + 0xd8) = pFVar7;
            }
            plVar8 = plVar8 + 1;
          } while (plVar8 != plVar5);
        }
      }
      iVar4 = (*(source->super_ASTObject)._vptr_ASTObject[0xb])();
      puVar3 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var_00,iVar4))[1];
      for (puVar9 = *(undefined8 **)CONCAT44(extraout_var_00,iVar4); puVar9 != puVar3;
          puVar9 = puVar9 + 1) {
        if (((VariableDeclaration *)*puVar9)->isExternal == true) {
          addExternalVariable(this,(VariableDeclaration *)*puVar9);
        }
      }
      local_e0.numActive = 0;
      if ((8 < local_e0.numAllocated) && (local_e0.items != (Identifier *)0x0)) {
        operator_delete__(local_e0.items);
      }
      return;
    }
    iVar4 = 0x23;
    location = "toString";
    message = "isValid()";
  }
  throwInternalCompilerError(message,location,iVar4);
}

Assistant:

HEARTGenerator (AST::ModuleBase& source, Module& targetModule, uint32_t maxDepth)
        : module (targetModule), builder (targetModule), maxExpressionDepth (maxDepth)
    {
        auto path = source.getFullyQualifiedPath();
        module.shortName = path.getLastPart().toString();
        module.fullName = path.toString();
        module.originalFullName = getOriginalModulePath (path);

        if (auto fns = source.getFunctionList())
        {
            for (auto& f : *fns)
            {
                if (! f->isGeneric())
                {
                    auto name = getFunctionName (f);
                    auto& af = module.functions.add (name, false);
                    f->generatedFunction = af;
                }
            }
        }

        auto& vars = source.getStateVariableList();

        for (auto& v : vars)
            if (v->isExternal)
                addExternalVariable (v);
    }